

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_4::checkOpenEXRFile
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  byte in_R8B;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  size_t in_stack_00000010;
  PtrIStream stream;
  bool in_stack_000001ae;
  bool in_stack_000001af;
  PtrIStream *in_stack_000001b0;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  PtrIStream *in_stack_ffffffffffffffa0;
  undefined1 local_1;
  
  if ((in_R8B & 1) == 0) {
    anon_unknown_0::PtrIStream::PtrIStream
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_1 = anon_unknown_0::runChecks<Imf_3_4::(anonymous_namespace)::PtrIStream>
                        (in_stack_000001b0,in_stack_000001af,in_stack_000001ae);
    anon_unknown_0::PtrIStream::~PtrIStream((PtrIStream *)0x116231);
  }
  else {
    local_1 = anon_unknown_0::runCoreChecks
                        ((char *)stream._0_8_,in_stack_00000010,in_stack_0000000f,in_stack_0000000e)
    ;
  }
  return local_1;
}

Assistant:

bool
checkOpenEXRFile (
    const char* data,
    size_t      numBytes,
    bool        reduceMemory,
    bool        reduceTime,
    bool        runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (data, numBytes, reduceMemory, reduceTime);
    }
    else
    {
        PtrIStream stream (data, numBytes);
        return runChecks (stream, reduceMemory, reduceTime);
    }
}